

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O0

void __thiscall
ctemplate::SectionTemplateNode::DumpToString(SectionTemplateNode *this,int level,string *out)

{
  string *out_00;
  int level_00;
  bool bVar1;
  reference ppTVar2;
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [32];
  _Self local_90;
  _Self local_88;
  const_iterator iter;
  string local_78 [55];
  allocator local_41;
  string local_40 [32];
  string *local_20;
  string *out_local;
  SectionTemplateNode *pSStack_10;
  int level_local;
  SectionTemplateNode *this_local;
  
  local_20 = out;
  out_local._4_4_ = level;
  pSStack_10 = this;
  if (out != (string *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"Section Start: ",&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"\n",(allocator *)((long)&iter._M_node + 7));
    AppendTokenWithIndent(level,out,(string *)local_40,&this->token_,(string *)local_78);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)((long)&iter._M_node + 7));
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    local_88._M_node =
         (_List_node_base *)
         std::__cxx11::list<ctemplate::TemplateNode_*,_std::allocator<ctemplate::TemplateNode_*>_>::
         begin(&this->node_list_);
    while( true ) {
      local_90._M_node =
           (_List_node_base *)
           std::__cxx11::list<ctemplate::TemplateNode_*,_std::allocator<ctemplate::TemplateNode_*>_>
           ::end(&this->node_list_);
      bVar1 = std::operator!=(&local_88,&local_90);
      level_00 = out_local._4_4_;
      out_00 = local_20;
      if (!bVar1) break;
      ppTVar2 = std::_List_const_iterator<ctemplate::TemplateNode_*>::operator*(&local_88);
      (*(*ppTVar2)->_vptr_TemplateNode[4])(*ppTVar2,(ulong)(out_local._4_4_ + 1),local_20);
      std::_List_const_iterator<ctemplate::TemplateNode_*>::operator++(&local_88);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"Section End: ",&local_b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,"\n",&local_d9);
    AppendTokenWithIndent(level_00,out_00,(string *)local_b0,&this->token_,(string *)local_d8);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    return;
  }
  __assert_fail("out",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                ,0x5f1,
                "virtual void ctemplate::SectionTemplateNode::DumpToString(int, string *) const");
}

Assistant:

void SectionTemplateNode::DumpToString(int level, string *out) const {
  assert(out);
  AppendTokenWithIndent(level, out, "Section Start: ", token_, "\n");
  NodeList::const_iterator iter = node_list_.begin();
  for (; iter != node_list_.end(); ++iter) {
    (*iter)->DumpToString(level + 1, out);
  }
  AppendTokenWithIndent(level, out, "Section End: ", token_, "\n");
}